

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupAndOr(Gia_Man_t *p,int nOuts,int fUseOr,int fCompl)

{
  uint uVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *__dest;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x954,"Gia_Man_t *Gia_ManDupAndOr(Gia_Man_t *, int, int, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar8 = p->vCis;
  uVar10 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    lVar12 = 0;
    do {
      if ((int)uVar10 <= lVar12) goto LAB_0068339d;
      iVar4 = pVVar8->pArray[lVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00683340;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) {
LAB_0068335f:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_0068335f;
      pGVar2[iVar4].Value = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCis;
      uVar10 = (ulong)pVVar8->nSize;
    } while (lVar12 < (long)(uVar10 - (long)p->nRegs));
  }
  iVar4 = p->nObjs;
  if (0 < iVar4) {
    lVar13 = 8;
    lVar12 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar10 = *(ulong *)((long)pGVar2 + lVar13 + -8);
      if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
        uVar1 = *(uint *)((long)pGVar2 +
                         lVar13 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar5 = *(uint *)((long)pGVar2 +
                             lVar13 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar5 < 0)) goto LAB_0068337e;
        iVar4 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar10 >> 0x1d) & 1,
                               uVar5 ^ (uint)(uVar10 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar13) = iVar4;
        iVar4 = p->nObjs;
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar12 < iVar4);
  }
  pVVar8 = p->vCos;
  uVar1 = pVVar8->nSize;
  uVar10 = (ulong)uVar1;
  if (fUseOr == 0) {
    uVar5 = 1;
    if ((int)uVar1 <= p->nRegs) goto LAB_006832e1;
    lVar12 = 0;
    do {
      if ((int)uVar10 <= lVar12) goto LAB_0068339d;
      iVar4 = pVVar8->pArray[lVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00683340;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      uVar11 = (uint)*(undefined8 *)pGVar2;
      uVar1 = pGVar2[-(ulong)(uVar11 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_0068337e;
      uVar5 = Gia_ManHashAnd(p_00,uVar5,uVar11 >> 0x1d & 1 ^ uVar1);
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCos;
      uVar10 = (ulong)pVVar8->nSize;
    } while (lVar12 < (long)(uVar10 - (long)p->nRegs));
  }
  else {
    uVar5 = 0;
    if ((int)uVar1 <= p->nRegs) goto LAB_006832e1;
    lVar12 = 0;
    uVar5 = 0;
    do {
      if ((int)uVar10 <= lVar12) {
LAB_0068339d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar8->pArray[lVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00683340:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      uVar11 = (uint)*(undefined8 *)pGVar2;
      uVar1 = pGVar2[-(ulong)(uVar11 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_0068337e;
      uVar5 = Gia_ManHashOr(p_00,uVar5,uVar11 >> 0x1d & 1 ^ uVar1);
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCos;
      uVar10 = (ulong)pVVar8->nSize;
    } while (lVar12 < (long)(uVar10 - (long)p->nRegs));
  }
  if ((int)uVar5 < 0) {
LAB_0068337e:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10f,"int Abc_LitNotCond(int, int)");
  }
LAB_006832e1:
  if (0 < nOuts) {
    do {
      Gia_ManAppendCo(p_00,uVar5 ^ 0 < fCompl);
      nOuts = nOuts + -1;
    } while (nOuts != 0);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManDupAndOr( Gia_Man_t * p, int nOuts, int fUseOr, int fCompl )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iResult;
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fUseOr ) // construct OR of all POs
    {
        iResult = 0;
        Gia_ManForEachPo( p, pObj, i )
            iResult = Gia_ManHashOr( pNew, iResult, Gia_ObjFanin0Copy(pObj) );
    }
    else // construct AND of all POs
    {
        iResult = 1;
        Gia_ManForEachPo( p, pObj, i )
            iResult = Gia_ManHashAnd( pNew, iResult, Gia_ObjFanin0Copy(pObj) );
    }
    iResult = Abc_LitNotCond( iResult, (int)(fCompl > 0) );
//    Gia_ManForEachPo( p, pObj, i )
//        pObj->Value = Gia_ManAppendCo( pNew, iResult );
    for ( i = 0; i < nOuts; i++ )
        Gia_ManAppendCo( pNew, iResult );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}